

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateExtension
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  Printer *this_00;
  bool bVar1;
  CppType CVar2;
  FieldDescriptor *pFVar3;
  string *__return_storage_ptr__;
  FileDescriptor *pFVar4;
  int i;
  int i_00;
  int i_01;
  GeneratorOptions *extraout_RDX;
  GeneratorOptions *extraout_RDX_00;
  GeneratorOptions *options_00;
  GeneratorOptions *options_01;
  GeneratorOptions *options_02;
  GeneratorOptions *options_03;
  GeneratorOptions *options_04;
  GeneratorOptions *options_05;
  char *pcVar5;
  Descriptor *pDVar6;
  BytesMode bytes_mode;
  allocator local_19d;
  CppType local_19c;
  Printer *local_198;
  string local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string extension_scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pFVar3 = field;
  if (*(GeneratorOptions **)(field + 0x68) == (GeneratorOptions *)0x0) {
    (anonymous_namespace)::GetFilePath_abi_cxx11_
              (&extension_scope,(_anonymous_namespace_ *)options,
               *(GeneratorOptions **)(field + 0x30),(FileDescriptor *)field);
    options_00 = extraout_RDX_00;
  }
  else {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&extension_scope,(_anonymous_namespace_ *)options,
               *(GeneratorOptions **)(field + 0x68),(Descriptor *)field);
    options_00 = extraout_RDX;
  }
  bytes_mode = 0x254f67;
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_190,(_anonymous_namespace_ *)field,options_00,pFVar3);
  __return_storage_ptr__ = &local_170;
  (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
             (FieldDescriptor *)0x0,true,false,false,bytes_mode);
  io::Printer::Print(printer,
                     "\n/**\n * A tuple of {field number, class constructor} for the extension\n * field named `$name$`.\n * @type {!jspb.ExtensionFieldInfo.<$extensionType$>}\n */\n$class$.$name$ = new jspb.ExtensionFieldInfo(\n"
                     ,"name",&local_190,"class",&extension_scope,"extensionType",
                     __return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  SimpleItoa_abi_cxx11_(&local_190,(protobuf *)(ulong)*(uint *)(field + 0x38),i);
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_170,(_anonymous_namespace_ *)field,options_01,
             (FieldDescriptor *)__return_storage_ptr__);
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 == CPPTYPE_MESSAGE) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_150,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string((string *)&local_150,"null",&local_19d);
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 == CPPTYPE_MESSAGE) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)__return_storage_ptr__);
    std::operator+(&local_130,&local_50,".toObject");
  }
  else {
    std::__cxx11::string::string((string *)&local_130,"null",(allocator *)&local_50);
  }
  pcVar5 = ", 0";
  if (*(int *)(field + 0x4c) == 3) {
    pcVar5 = ", 1";
  }
  local_198 = printer;
  std::__cxx11::string::string((string *)&local_d0,pcVar5 + 2,(allocator *)&local_f0);
  pDVar6 = (Descriptor *)0x3504c7;
  io::Printer::Print(local_198,
                     "    $index$,\n    {$name$: 0},\n    $ctor$,\n     /** @type {?function((boolean|undefined),!jspb.Message=): !Object} */ (\n         $toObject$),\n    $repeated$);\n"
                     ,"index",&local_190,"name",&local_170,"ctor",&local_150,"toObject",&local_130,
                     "repeated",&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_130);
  if (CVar2 == CPPTYPE_MESSAGE) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  pFVar4 = *(FileDescriptor **)(field + 0x58);
  (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
            (&local_190,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x30),pFVar4
             ,pDVar6);
  SimpleItoa_abi_cxx11_(&local_170,(protobuf *)(ulong)*(uint *)(field + 0x38),i_00);
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_150,(_anonymous_namespace_ *)field,options_02,(FieldDescriptor *)pFVar4);
  (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
            (&local_130,(_anonymous_namespace_ *)field,options_03,(FieldDescriptor *)pFVar4);
  (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
            (&local_d0,(_anonymous_namespace_ *)field,options_04,(FieldDescriptor *)pFVar4);
  local_19c = FieldDescriptor::cpp_type(field);
  if (local_19c == CPPTYPE_MESSAGE) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)pFVar4);
    std::operator+(&local_f0,&local_70,".serializeBinaryToWriter");
  }
  else {
    std::__cxx11::string::string((string *)&local_f0,"undefined",(allocator *)&local_70);
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 == CPPTYPE_MESSAGE) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)pFVar4);
    std::operator+(&local_90,&local_b0,".deserializeBinaryFromReader");
  }
  else {
    std::__cxx11::string::string((string *)&local_90,"undefined",(allocator *)&local_b0);
  }
  pDVar6 = (Descriptor *)0x3556f7;
  io::Printer::Print(local_198,
                     "\n$extendName$Binary[$index$] = new jspb.ExtensionFieldBinaryInfo(\n    $class$.$name$,\n    $binaryReaderFn$,\n    $binaryWriterFn$,\n    $binaryMessageSerializeFn$,\n    $binaryMessageDeserializeFn$,\n"
                     ,"extendName",&local_190,"index",&local_170,"class",&extension_scope,"name",
                     &local_150,"binaryReaderFn",&local_130,"binaryWriterFn",&local_d0,
                     "binaryMessageSerializeFn",&local_f0,"binaryMessageDeserializeFn",&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (CVar2 == CPPTYPE_MESSAGE) {
    std::__cxx11::string::~string((string *)&local_b0);
  }
  this_00 = local_198;
  std::__cxx11::string::~string((string *)&local_f0);
  if (local_19c == CPPTYPE_MESSAGE) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  bVar1 = FieldDescriptor::is_packed(field);
  pcVar5 = "false";
  if (bVar1) {
    pcVar5 = "true";
  }
  std::__cxx11::string::string((string *)&local_190,pcVar5,(allocator *)&local_170);
  io::Printer::Print(this_00,"    $isPacked$);\n","isPacked",&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  pFVar4 = *(FileDescriptor **)(field + 0x58);
  (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
            (&local_190,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x30),pFVar4
             ,pDVar6);
  SimpleItoa_abi_cxx11_(&local_170,(protobuf *)(ulong)*(uint *)(field + 0x38),i_01);
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_150,(_anonymous_namespace_ *)field,options_05,(FieldDescriptor *)pFVar4);
  io::Printer::Print(this_00,
                     "// This registers the extension field with the extended class, so that\n// toObject() will function correctly.\n$extendName$[$index$] = $class$.$name$;\n\n"
                     ,"extendName",&local_190,"index",&local_170,"class",&extension_scope,"name",
                     &local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&extension_scope);
  return;
}

Assistant:

void Generator::GenerateExtension(const GeneratorOptions& options,
                                  io::Printer* printer,
                                  const FieldDescriptor* field) const {
  string extension_scope =
      (field->extension_scope()
           ? GetMessagePath(options, field->extension_scope())
           : GetFilePath(options, field->file()));

  printer->Print(
      "\n"
      "/**\n"
      " * A tuple of {field number, class constructor} for the extension\n"
      " * field named `$name$`.\n"
      " * @type {!jspb.ExtensionFieldInfo.<$extensionType$>}\n"
      " */\n"
      "$class$.$name$ = new jspb.ExtensionFieldInfo(\n",
      "name", JSObjectFieldName(options, field),
      "class", extension_scope,
      "extensionType", JSFieldTypeAnnotation(
          options, field,
          /* is_setter_argument = */ false,
          /* force_present = */ true,
          /* singular_if_not_packed = */ false));
  printer->Print(
      "    $index$,\n"
      "    {$name$: 0},\n"
      "    $ctor$,\n"
      "     /** @type {?function((boolean|undefined),!jspb.Message=): "
      "!Object} */ (\n"
      "         $toObject$),\n"
      "    $repeated$);\n",
      "index", SimpleItoa(field->number()),
      "name", JSObjectFieldName(options, field),
      "ctor", (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ?
               SubmessageTypeRef(options, field) : string("null")),
      "toObject", (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ?
                   (SubmessageTypeRef(options, field) + ".toObject") :
                   string("null")),
      "repeated", (field->is_repeated() ? "1" : "0"));

  printer->Print(
      "\n"
      "$extendName$Binary[$index$] = new jspb.ExtensionFieldBinaryInfo(\n"
      "    $class$.$name$,\n"
      "    $binaryReaderFn$,\n"
      "    $binaryWriterFn$,\n"
      "    $binaryMessageSerializeFn$,\n"
      "    $binaryMessageDeserializeFn$,\n",
      "extendName",
      JSExtensionsObjectName(options, field->file(), field->containing_type()),
      "index", SimpleItoa(field->number()), "class", extension_scope, "name",
      JSObjectFieldName(options, field), "binaryReaderFn",
      JSBinaryReaderMethodName(options, field), "binaryWriterFn",
      JSBinaryWriterMethodName(options, field), "binaryMessageSerializeFn",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE)
          ? (SubmessageTypeRef(options, field) + ".serializeBinaryToWriter")
          : "undefined",
      "binaryMessageDeserializeFn",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE)
          ? (SubmessageTypeRef(options, field) + ".deserializeBinaryFromReader")
          : "undefined");

  printer->Print("    $isPacked$);\n", "isPacked",
                 (field->is_packed() ? "true" : "false"));

  printer->Print(
      "// This registers the extension field with the extended class, so that\n"
      "// toObject() will function correctly.\n"
      "$extendName$[$index$] = $class$.$name$;\n"
      "\n",
      "extendName", JSExtensionsObjectName(options, field->file(),
                                           field->containing_type()),
      "index", SimpleItoa(field->number()),
      "class", extension_scope,
      "name", JSObjectFieldName(options, field));
}